

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

Func * __thiscall wabt::Module::GetFunc(Module *this,Var *var)

{
  Index IVar1;
  Func *pFVar2;
  
  IVar1 = BindingHash::FindIndex(&this->func_bindings,var);
  if ((ulong)IVar1 < (ulong)(*(long *)&this->field_0x90 - *(long *)&this->funcs >> 3)) {
    pFVar2 = *(Func **)(*(long *)&this->funcs + (ulong)IVar1 * 8);
  }
  else {
    pFVar2 = (Func *)0x0;
  }
  return pFVar2;
}

Assistant:

const Func* Module::GetFunc(const Var& var) const {
  return const_cast<Module*>(this)->GetFunc(var);
}